

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_pubkey.cpp
# Opt level: O0

void __thiscall Pubkey_CombineTest_Test::~Pubkey_CombineTest_Test(Pubkey_CombineTest_Test *this)

{
  Pubkey_CombineTest_Test *this_local;
  
  ~Pubkey_CombineTest_Test(this);
  operator_delete(this);
  return;
}

Assistant:

TEST(Pubkey, CombineTest) {
  // https://planethouki.wordpress.com/2018/03/15/pubkey-add-ecdsa/
  Privkey sk_a("1d52f68124c59c3125d5c2e043cabf01cef46fafaf45be3132fc1f52ff0ec434");
  Privkey sk_b("353a88e3c404380d9970d9b2d8ee9f6051b3d817ab32aabc12f5c3c65086e659");
  std::string exp_sk_c = "528d7f64e8c9d43ebf469c931cb95e6220a847c75a7868ed45f1e3194f95aa8d";
  std::string exp_pk_c = "03c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";

  auto pk_a = sk_a.GetPubkey();
  auto pk_b = sk_b.GetPubkey();

  auto pk_c1 = pk_a + pk_b;
  Pubkey pk_c2 = pk_b;
  pk_c2 += pk_a;

  auto sk_c = sk_a + sk_b;
  auto pk_c3 = sk_c.GetPubkey();

  EXPECT_EQ(exp_pk_c, pk_c1.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c2.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c3.GetHex());
  EXPECT_EQ(exp_sk_c, sk_c.GetHex());

  Pubkey pk_a1("024d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_a2("034d18084bb47027f47d428b2ed67e1ccace5520fdc36f308e272394e288d53b6d");
  Pubkey pk_b1("02dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  Pubkey pk_b2("03dc82121e4ff8d23745f3859e8939ecb0a38af63e6ddea2fff97a7fd61a1d2d54");
  std::string exp_pk_cp = "02c6cf31d72599553158c6ffed6139946bbd3a1648a6b1ef56bea812878bb2df71";
  std::string exp_pk_c2 = "03417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";
  std::string exp_pk_c2p = "02417885176062c3ae707af06059e7b5e65f733938f818da509eb3e5c4074b8124";

  auto pk_c11 = pk_a1 + pk_b1;
  auto pk_c12 = pk_a2 + pk_b1;
  auto pk_c13 = pk_a1 + pk_b2;
  auto pk_c14 = pk_a2 + pk_b2;

  EXPECT_EQ(exp_pk_cp, pk_c11.GetHex());
  EXPECT_EQ(exp_pk_c2, pk_c12.GetHex());
  EXPECT_EQ(exp_pk_c2p, pk_c13.GetHex());
  EXPECT_EQ(exp_pk_c, pk_c14.GetHex());
}